

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextOutputStream.cpp
# Opt level: O2

void __thiscall
binlog::TextOutputStream::TextOutputStream
          (TextOutputStream *this,ostream *out,string *eventFormat,string *dateFormat)

{
  string sStack_68;
  string local_48;
  
  this->_out = out;
  EventStream::EventStream(&this->_eventStream);
  std::__cxx11::string::string((string *)&local_48,(string *)eventFormat);
  std::__cxx11::string::string((string *)&sStack_68,(string *)dateFormat);
  PrettyPrinter::PrettyPrinter(&this->_printer,&local_48,&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

TextOutputStream::TextOutputStream(std::ostream& out, std::string eventFormat, std::string dateFormat)
  :_out(out),
   _printer(std::move(eventFormat), std::move(dateFormat))
{}